

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O3

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::texture_grad
               (NegativeTestContext *ctx)

{
  ShaderType shaderType;
  string shaderSource_00;
  string shaderSource_01;
  string shaderSource_02;
  string shaderSource_03;
  string shaderSource_04;
  string shaderSource_05;
  string shaderSource_06;
  string shaderSource_07;
  string shaderSource_08;
  bool bVar1;
  ContextType ctxType;
  char *__s;
  long *plVar2;
  NotSupportedError *this;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  long lVar4;
  string shaderSource;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffffe3c;
  DataType in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe44;
  _Alloc_hider _Var6;
  size_type sVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  allocator<char> local_191;
  long *local_190 [2];
  long local_180 [2];
  long *local_170 [2];
  long local_160 [2];
  long *local_150 [2];
  long local_140 [2];
  long *local_130 [2];
  long local_120 [2];
  long *local_110 [2];
  long local_100 [2];
  long *local_f0 [2];
  long local_e0 [2];
  long *local_d0 [2];
  long local_c0 [2];
  long *local_b0 [2];
  long local_a0 [2];
  long *local_90 [2];
  long local_80 [2];
  string local_70;
  long *local_50 [2];
  long local_40 [2];
  
  paVar3 = &local_70.field_2;
  local_70._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"GL_EXT_texture_cube_map_array","");
  bVar1 = NegativeTestContext::isExtensionSupported(ctx,&local_70);
  if (bVar1) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar3) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    ctxType.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
    bVar1 = glu::contextSupports(ctxType,(ApiType)0x23);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar3) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if (!bVar1) {
      this = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this,"Test requires support for GL_EXT_texture_cube_map_array or version 3.2.",
                 "ctx.isExtensionSupported(\"GL_EXT_texture_cube_map_array\") || contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2))"
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fNegativeShaderFunctionTests.cpp"
                 ,0xc21);
      __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  _Var6._M_p = (pointer)&local_1a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffe48,"textureGrad.","");
  NegativeTestContext::beginSection(ctx,(string *)&stack0xfffffffffffffe48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var6._M_p != &local_1a8) {
    operator_delete(_Var6._M_p,local_1a8._M_allocated_capacity + 1);
  }
  lVar4 = 0;
  do {
    shaderType = *(ShaderType *)
                  ((long)&NegativeTestShared::(anonymous_namespace)::s_shaders + lVar4);
    bVar1 = NegativeTestContext::isShaderSupported(ctx,shaderType);
    if (bVar1) {
      __s = glu::getShaderTypeName(shaderType);
      std::__cxx11::string::string<std::allocator<char>>((string *)local_50,__s,&local_191);
      plVar2 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x1c79853);
      paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 == paVar3) {
        local_1a8._M_allocated_capacity = paVar3->_M_allocated_capacity;
        local_1a8._8_8_ = plVar2[3];
        _Var6._M_p = (pointer)&local_1a8;
      }
      else {
        local_1a8._M_allocated_capacity = paVar3->_M_allocated_capacity;
        _Var6._M_p = (pointer)*plVar2;
      }
      sVar7 = plVar2[1];
      *plVar2 = (long)paVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      NegativeTestContext::beginSection(ctx,(string *)&stack0xfffffffffffffe48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var6._M_p != &local_1a8) {
        operator_delete(_Var6._M_p,local_1a8._M_allocated_capacity + 1);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      uVar5 = 3;
      NegativeTestShared::(anonymous_namespace)::genShaderSourceTextureGrad_abi_cxx11_
                ((string *)&stack0xfffffffffffffe48,(_anonymous_namespace_ *)ctx,
                 (NegativeTestContext *)(ulong)shaderType,0x2d,TYPE_FLOAT,TYPE_FLOAT_VEC3,
                 TYPE_FLOAT_VEC3,in_stack_fffffffffffffe40);
      local_90[0] = local_80;
      std::__cxx11::string::_M_construct<char*>((string *)local_90,_Var6._M_p,_Var6._M_p + sVar7);
      shaderSource_00._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffe3c;
      shaderSource_00._M_dataplus._M_p._0_4_ = uVar5;
      shaderSource_00._M_string_length._0_4_ = in_stack_fffffffffffffe40;
      shaderSource_00._M_string_length._4_4_ = in_stack_fffffffffffffe44;
      shaderSource_00.field_2._M_allocated_capacity = (size_type)_Var6._M_p;
      shaderSource_00.field_2._8_8_ = sVar7;
      verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                   (ShaderType)local_90[0],shaderSource_00);
      if (local_90[0] != local_80) {
        operator_delete(local_90[0],local_80[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var6._M_p != &local_1a8) {
        operator_delete(_Var6._M_p,local_1a8._M_allocated_capacity + 1);
      }
      uVar5 = 3;
      NegativeTestShared::(anonymous_namespace)::genShaderSourceTextureGrad_abi_cxx11_
                ((string *)&stack0xfffffffffffffe48,(_anonymous_namespace_ *)ctx,
                 (NegativeTestContext *)(ulong)shaderType,0x2d,TYPE_FLOAT_VEC4,TYPE_FLOAT,
                 TYPE_FLOAT_VEC3,in_stack_fffffffffffffe40);
      local_b0[0] = local_a0;
      std::__cxx11::string::_M_construct<char*>((string *)local_b0,_Var6._M_p,_Var6._M_p + sVar7);
      shaderSource_01._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffe3c;
      shaderSource_01._M_dataplus._M_p._0_4_ = uVar5;
      shaderSource_01._M_string_length._0_4_ = in_stack_fffffffffffffe40;
      shaderSource_01._M_string_length._4_4_ = in_stack_fffffffffffffe44;
      shaderSource_01.field_2._M_allocated_capacity = (size_type)_Var6._M_p;
      shaderSource_01.field_2._8_8_ = sVar7;
      verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                   (ShaderType)local_b0[0],shaderSource_01);
      if (local_b0[0] != local_a0) {
        operator_delete(local_b0[0],local_a0[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var6._M_p != &local_1a8) {
        operator_delete(_Var6._M_p,local_1a8._M_allocated_capacity + 1);
      }
      uVar5 = 1;
      NegativeTestShared::(anonymous_namespace)::genShaderSourceTextureGrad_abi_cxx11_
                ((string *)&stack0xfffffffffffffe48,(_anonymous_namespace_ *)ctx,
                 (NegativeTestContext *)(ulong)shaderType,0x2d,TYPE_FLOAT_VEC4,TYPE_FLOAT_VEC3,
                 TYPE_FLOAT,in_stack_fffffffffffffe40);
      local_d0[0] = local_c0;
      std::__cxx11::string::_M_construct<char*>((string *)local_d0,_Var6._M_p,_Var6._M_p + sVar7);
      shaderSource_02._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffe3c;
      shaderSource_02._M_dataplus._M_p._0_4_ = uVar5;
      shaderSource_02._M_string_length._0_4_ = in_stack_fffffffffffffe40;
      shaderSource_02._M_string_length._4_4_ = in_stack_fffffffffffffe44;
      shaderSource_02.field_2._M_allocated_capacity = (size_type)_Var6._M_p;
      shaderSource_02.field_2._8_8_ = sVar7;
      verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                   (ShaderType)local_d0[0],shaderSource_02);
      if (local_d0[0] != local_c0) {
        operator_delete(local_d0[0],local_c0[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var6._M_p != &local_1a8) {
        operator_delete(_Var6._M_p,local_1a8._M_allocated_capacity + 1);
      }
      uVar5 = 3;
      NegativeTestShared::(anonymous_namespace)::genShaderSourceTextureGrad_abi_cxx11_
                ((string *)&stack0xfffffffffffffe48,(_anonymous_namespace_ *)ctx,
                 (NegativeTestContext *)(ulong)shaderType,0x3a,TYPE_FLOAT,TYPE_FLOAT_VEC3,
                 TYPE_FLOAT_VEC3,in_stack_fffffffffffffe40);
      local_f0[0] = local_e0;
      std::__cxx11::string::_M_construct<char*>((string *)local_f0,_Var6._M_p,_Var6._M_p + sVar7);
      shaderSource_03._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffe3c;
      shaderSource_03._M_dataplus._M_p._0_4_ = uVar5;
      shaderSource_03._M_string_length._0_4_ = in_stack_fffffffffffffe40;
      shaderSource_03._M_string_length._4_4_ = in_stack_fffffffffffffe44;
      shaderSource_03.field_2._M_allocated_capacity = (size_type)_Var6._M_p;
      shaderSource_03.field_2._8_8_ = sVar7;
      verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                   (ShaderType)local_f0[0],shaderSource_03);
      if (local_f0[0] != local_e0) {
        operator_delete(local_f0[0],local_e0[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var6._M_p != &local_1a8) {
        operator_delete(_Var6._M_p,local_1a8._M_allocated_capacity + 1);
      }
      uVar5 = 3;
      NegativeTestShared::(anonymous_namespace)::genShaderSourceTextureGrad_abi_cxx11_
                ((string *)&stack0xfffffffffffffe48,(_anonymous_namespace_ *)ctx,
                 (NegativeTestContext *)(ulong)shaderType,0x3a,TYPE_FLOAT_VEC4,TYPE_FLOAT,
                 TYPE_FLOAT_VEC3,in_stack_fffffffffffffe40);
      local_110[0] = local_100;
      std::__cxx11::string::_M_construct<char*>((string *)local_110,_Var6._M_p,_Var6._M_p + sVar7);
      shaderSource_04._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffe3c;
      shaderSource_04._M_dataplus._M_p._0_4_ = uVar5;
      shaderSource_04._M_string_length._0_4_ = in_stack_fffffffffffffe40;
      shaderSource_04._M_string_length._4_4_ = in_stack_fffffffffffffe44;
      shaderSource_04.field_2._M_allocated_capacity = (size_type)_Var6._M_p;
      shaderSource_04.field_2._8_8_ = sVar7;
      verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                   (ShaderType)local_110[0],shaderSource_04);
      if (local_110[0] != local_100) {
        operator_delete(local_110[0],local_100[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var6._M_p != &local_1a8) {
        operator_delete(_Var6._M_p,local_1a8._M_allocated_capacity + 1);
      }
      uVar5 = 1;
      NegativeTestShared::(anonymous_namespace)::genShaderSourceTextureGrad_abi_cxx11_
                ((string *)&stack0xfffffffffffffe48,(_anonymous_namespace_ *)ctx,
                 (NegativeTestContext *)(ulong)shaderType,0x3a,TYPE_FLOAT_VEC4,TYPE_FLOAT_VEC3,
                 TYPE_FLOAT,in_stack_fffffffffffffe40);
      local_130[0] = local_120;
      std::__cxx11::string::_M_construct<char*>((string *)local_130,_Var6._M_p,_Var6._M_p + sVar7);
      shaderSource_05._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffe3c;
      shaderSource_05._M_dataplus._M_p._0_4_ = uVar5;
      shaderSource_05._M_string_length._0_4_ = in_stack_fffffffffffffe40;
      shaderSource_05._M_string_length._4_4_ = in_stack_fffffffffffffe44;
      shaderSource_05.field_2._M_allocated_capacity = (size_type)_Var6._M_p;
      shaderSource_05.field_2._8_8_ = sVar7;
      verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                   (ShaderType)local_130[0],shaderSource_05);
      if (local_130[0] != local_120) {
        operator_delete(local_130[0],local_120[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var6._M_p != &local_1a8) {
        operator_delete(_Var6._M_p,local_1a8._M_allocated_capacity + 1);
      }
      uVar5 = 3;
      NegativeTestShared::(anonymous_namespace)::genShaderSourceTextureGrad_abi_cxx11_
                ((string *)&stack0xfffffffffffffe48,(_anonymous_namespace_ *)ctx,
                 (NegativeTestContext *)(ulong)shaderType,0x41,TYPE_FLOAT,TYPE_FLOAT_VEC3,
                 TYPE_FLOAT_VEC3,in_stack_fffffffffffffe40);
      local_150[0] = local_140;
      std::__cxx11::string::_M_construct<char*>((string *)local_150,_Var6._M_p,_Var6._M_p + sVar7);
      shaderSource_06._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffe3c;
      shaderSource_06._M_dataplus._M_p._0_4_ = uVar5;
      shaderSource_06._M_string_length._0_4_ = in_stack_fffffffffffffe40;
      shaderSource_06._M_string_length._4_4_ = in_stack_fffffffffffffe44;
      shaderSource_06.field_2._M_allocated_capacity = (size_type)_Var6._M_p;
      shaderSource_06.field_2._8_8_ = sVar7;
      verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                   (ShaderType)local_150[0],shaderSource_06);
      if (local_150[0] != local_140) {
        operator_delete(local_150[0],local_140[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var6._M_p != &local_1a8) {
        operator_delete(_Var6._M_p,local_1a8._M_allocated_capacity + 1);
      }
      uVar5 = 3;
      NegativeTestShared::(anonymous_namespace)::genShaderSourceTextureGrad_abi_cxx11_
                ((string *)&stack0xfffffffffffffe48,(_anonymous_namespace_ *)ctx,
                 (NegativeTestContext *)(ulong)shaderType,0x41,TYPE_FLOAT_VEC4,TYPE_FLOAT,
                 TYPE_FLOAT_VEC3,in_stack_fffffffffffffe40);
      local_170[0] = local_160;
      std::__cxx11::string::_M_construct<char*>((string *)local_170,_Var6._M_p,_Var6._M_p + sVar7);
      shaderSource_07._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffe3c;
      shaderSource_07._M_dataplus._M_p._0_4_ = uVar5;
      shaderSource_07._M_string_length._0_4_ = in_stack_fffffffffffffe40;
      shaderSource_07._M_string_length._4_4_ = in_stack_fffffffffffffe44;
      shaderSource_07.field_2._M_allocated_capacity = (size_type)_Var6._M_p;
      shaderSource_07.field_2._8_8_ = sVar7;
      verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                   (ShaderType)local_170[0],shaderSource_07);
      if (local_170[0] != local_160) {
        operator_delete(local_170[0],local_160[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var6._M_p != &local_1a8) {
        operator_delete(_Var6._M_p,local_1a8._M_allocated_capacity + 1);
      }
      uVar5 = 1;
      NegativeTestShared::(anonymous_namespace)::genShaderSourceTextureGrad_abi_cxx11_
                ((string *)&stack0xfffffffffffffe48,(_anonymous_namespace_ *)ctx,
                 (NegativeTestContext *)(ulong)shaderType,0x41,TYPE_FLOAT_VEC4,TYPE_FLOAT_VEC3,
                 TYPE_FLOAT,in_stack_fffffffffffffe40);
      local_190[0] = local_180;
      std::__cxx11::string::_M_construct<char*>((string *)local_190,_Var6._M_p,_Var6._M_p + sVar7);
      shaderSource_08._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffe3c;
      shaderSource_08._M_dataplus._M_p._0_4_ = uVar5;
      shaderSource_08._M_string_length._0_4_ = in_stack_fffffffffffffe40;
      shaderSource_08._M_string_length._4_4_ = in_stack_fffffffffffffe44;
      shaderSource_08.field_2._M_allocated_capacity = (size_type)_Var6._M_p;
      shaderSource_08.field_2._8_8_ = sVar7;
      verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                   (ShaderType)local_190[0],shaderSource_08);
      if (local_190[0] != local_180) {
        operator_delete(local_190[0],local_180[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var6._M_p != &local_1a8) {
        operator_delete(_Var6._M_p,local_1a8._M_allocated_capacity + 1);
      }
      NegativeTestContext::endSection(ctx);
    }
    lVar4 = lVar4 + 4;
  } while (lVar4 != 0x18);
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void texture_grad (NegativeTestContext& ctx)
{
	TCU_CHECK_AND_THROW(NotSupportedError, ctx.isExtensionSupported("GL_EXT_texture_cube_map_array") || contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)), "Test requires support for GL_EXT_texture_cube_map_array or version 3.2.");

	ctx.beginSection("textureGrad.");
	for (int shaderNdx = 0; shaderNdx < DE_LENGTH_OF_ARRAY(s_shaders); ++shaderNdx)
	{
		if (ctx.isShaderSupported(s_shaders[shaderNdx]))
		{
			ctx.beginSection("Verify shader: " + std::string(getShaderTypeName(s_shaders[shaderNdx])));
			{
				const std::string shaderSource(genShaderSourceTextureGrad(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_ARRAY, glu::TYPE_FLOAT, glu::TYPE_FLOAT_VEC3, glu::TYPE_FLOAT_VEC3));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGrad(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_ARRAY, glu::TYPE_FLOAT_VEC4, glu::TYPE_FLOAT, glu::TYPE_FLOAT_VEC3));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGrad(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_ARRAY, glu::TYPE_FLOAT_VEC4, glu::TYPE_FLOAT_VEC3, glu::TYPE_FLOAT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGrad(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_CUBE_ARRAY, glu::TYPE_FLOAT, glu::TYPE_FLOAT_VEC3, glu::TYPE_FLOAT_VEC3));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGrad(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_CUBE_ARRAY, glu::TYPE_FLOAT_VEC4, glu::TYPE_FLOAT, glu::TYPE_FLOAT_VEC3));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGrad(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_CUBE_ARRAY, glu::TYPE_FLOAT_VEC4, glu::TYPE_FLOAT_VEC3, glu::TYPE_FLOAT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGrad(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_CUBE_ARRAY, glu::TYPE_FLOAT, glu::TYPE_FLOAT_VEC3, glu::TYPE_FLOAT_VEC3));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGrad(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_CUBE_ARRAY, glu::TYPE_FLOAT_VEC4, glu::TYPE_FLOAT, glu::TYPE_FLOAT_VEC3));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGrad(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_CUBE_ARRAY, glu::TYPE_FLOAT_VEC4, glu::TYPE_FLOAT_VEC3, glu::TYPE_FLOAT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			ctx.endSection();
		}
	}
	ctx.endSection();
}